

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<google::protobuf::Descriptor_const*,google::protobuf::compiler::SCC_const*>::
     construct<std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::compiler::SCC_const*>>,std::piecewise_construct_t_const&,std::tuple<google::protobuf::Descriptor_const*&>,std::tuple<google::protobuf::compiler::SCC_const*&&>>
               (allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<const_google::protobuf::Descriptor_*&> *args_1,
               tuple<const_google::protobuf::compiler::SCC_*&&> *args_2)

{
  tuple<const_google::protobuf::compiler::SCC_*&&> *args_local_2;
  tuple<const_google::protobuf::Descriptor_*&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>
  *alloc_local;
  
  map_slot_policy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>::
  emplace(slot);
  std::
  allocator_traits<std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::compiler::SCC_const*>>>
  ::
  construct<std::pair<google::protobuf::Descriptor_const*,google::protobuf::compiler::SCC_const*>,std::piecewise_construct_t_const&,std::tuple<google::protobuf::Descriptor_const*&>,std::tuple<google::protobuf::compiler::SCC_const*&&>>
            (alloc,(pair<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>
                    *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }